

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

mpc_input_t * mpc_input_new_string(char *filename,char *string)

{
  mpc_input_t *pmVar1;
  size_t sVar2;
  char *pcVar3;
  mpc_state_t *pmVar4;
  long local_40;
  long local_38;
  long local_30;
  undefined8 local_28;
  mpc_input_t *i;
  char *string_local;
  char *filename_local;
  
  pmVar1 = (mpc_input_t *)malloc(0x8278);
  sVar2 = strlen(filename);
  pcVar3 = (char *)malloc(sVar2 + 1);
  pmVar1->filename = pcVar3;
  strcpy(pmVar1->filename,filename);
  pmVar1->type = 0;
  mpc_state_new();
  (pmVar1->state).pos = local_40;
  (pmVar1->state).row = local_38;
  (pmVar1->state).col = local_30;
  *(undefined8 *)&(pmVar1->state).term = local_28;
  sVar2 = strlen(string);
  pcVar3 = (char *)malloc(sVar2 + 1);
  pmVar1->string = pcVar3;
  strcpy(pmVar1->string,string);
  pmVar1->buffer = (char *)0x0;
  pmVar1->file = (FILE *)0x0;
  pmVar1->suppress = 0;
  pmVar1->backtrack = 1;
  pmVar1->marks_num = 0;
  pmVar1->marks_slots = 0x20;
  pmVar4 = (mpc_state_t *)malloc((long)pmVar1->marks_slots << 5);
  pmVar1->marks = pmVar4;
  pcVar3 = (char *)malloc((long)pmVar1->marks_slots);
  pmVar1->lasts = pcVar3;
  pmVar1->last = '\0';
  pmVar1->mem_index = 0;
  memset(pmVar1->mem_full,0,0x200);
  return pmVar1;
}

Assistant:

static mpc_input_t *mpc_input_new_string(const char *filename, const char *string) {

  mpc_input_t *i = malloc(sizeof(mpc_input_t));

  i->filename = malloc(strlen(filename) + 1);
  strcpy(i->filename, filename);
  i->type = MPC_INPUT_STRING;

  i->state = mpc_state_new();

  i->string = malloc(strlen(string) + 1);
  strcpy(i->string, string);
  i->buffer = NULL;
  i->file = NULL;

  i->suppress = 0;
  i->backtrack = 1;
  i->marks_num = 0;
  i->marks_slots = MPC_INPUT_MARKS_MIN;
  i->marks = malloc(sizeof(mpc_state_t) * i->marks_slots);
  i->lasts = malloc(sizeof(char) * i->marks_slots);
  i->last = '\0';

  i->mem_index = 0;
  memset(i->mem_full, 0, sizeof(char) * MPC_INPUT_MEM_NUM);

  return i;
}